

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

QRegion __thiscall
QGraphicsViewPrivate::mapToViewRegion(QGraphicsViewPrivate *this,QGraphicsItem *item,QRectF *rect)

{
  long lVar1;
  QGraphicsItemPrivate *this_00;
  long lVar2;
  qreal *pqVar3;
  QTransform *pQVar4;
  long in_FS_OFFSET;
  byte bVar5;
  undefined1 local_e0 [8];
  QTransform local_d8;
  QTransform itv;
  
  bVar5 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (item->d_ptr).d;
  if (((ulong)item[0x30]._vptr_QGraphicsItem & 0x20) != 0) {
    updateScroll((QGraphicsViewPrivate *)item);
  }
  pqVar3 = (qreal *)&DAT_0067b698;
  pQVar4 = &itv;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    pQVar4->m_matrix[0][0] = *pqVar3;
    pqVar3 = pqVar3 + (ulong)bVar5 * -2 + 1;
    pQVar4 = (QTransform *)((long)pQVar4 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  QGraphicsView::viewportTransform((QTransform *)(local_e0 + 8),(QGraphicsView *)this_00);
  QGraphicsItem::deviceTransform(&itv,(QGraphicsItem *)rect,(QTransform *)(local_e0 + 8));
  QGraphicsItem::boundingRegion((QGraphicsItem *)local_e0,(QTransform *)rect);
  QTransform::mapRect((QRectF *)(local_e0 + 8));
  QRectF::toAlignedRect();
  QRegion::operator&((QRegion *)this,(QRect *)local_e0);
  QRegion::~QRegion((QRegion *)local_e0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QRegion)(QRegionData *)this;
  }
  __stack_chk_fail();
}

Assistant:

QRegion QGraphicsViewPrivate::mapToViewRegion(const QGraphicsItem *item, const QRectF &rect) const
{
    Q_Q(const QGraphicsView);
    if (dirtyScroll)
        const_cast<QGraphicsViewPrivate *>(this)->updateScroll();

    // Accurate bounding region
    QTransform itv = item->deviceTransform(q->viewportTransform());
    return item->boundingRegion(itv) & itv.mapRect(rect).toAlignedRect();
}